

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

uint32_t lys_module_pos(lys_module *module)

{
  long lVar1;
  LY_ERR *pLVar2;
  long lVar3;
  
  lVar1 = (long)(module->ctx->models).used;
  if (0 < lVar1) {
    lVar3 = 0;
    do {
      if ((module->ctx->models).list[lVar3] == module) {
        return (int)lVar3 + 1;
      }
      lVar3 = lVar3 + 1;
    } while (lVar1 != lVar3);
  }
  pLVar2 = ly_errno_location();
  *pLVar2 = LY_EINT;
  ly_log(LY_LLERR,"Internal error (%s:%d).",
         "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c",
         0xf73);
  return 0;
}

Assistant:

static uint32_t
lys_module_pos(struct lys_module *module)
{
    int i;
    uint32_t pos = 1;

    for (i = 0; i < module->ctx->models.used; ++i) {
        if (module->ctx->models.list[i] == module) {
            return pos;
        }
        ++pos;
    }

    LOGINT;
    return 0;
}